

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

void A_Weave(AActor *self,int xyspeed,int zspeed,double xydist,double zdist)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  DVector2 newpos;
  DVector2 local_80;
  double local_70;
  double local_68;
  uint local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  bVar1 = self->WeaveIndexZ;
  uVar5 = (uint)bVar1;
  local_68 = zdist;
  if ((xyspeed != 0) && ((xydist != 0.0 || (NAN(xydist))))) {
    local_5c = (uint)bVar1;
    local_48 = (self->Angles).Yaw.Degrees + 90.0;
    bVar1 = self->WeaveIndexXY;
    local_70 = xydist;
    dVar2 = FFastTrig::sin(&fasttrig,xydist);
    local_58 = dVar2 * 8.0 * local_70;
    dVar2 = (self->__Pos).X;
    local_50 = (self->__Pos).Y;
    dVar3 = FFastTrig::cos(&fasttrig,local_48 * 11930464.711111112 + 6755399441055744.0);
    dVar3 = dVar3 * local_58;
    dVar4 = FFastTrig::sin(&fasttrig,dVar3);
    local_80.Y = local_50 - dVar4 * local_58;
    uVar5 = xyspeed + (uint)bVar1 & 0x3f;
    local_80.X = dVar2 - dVar3;
    dVar2 = FFastTrig::sin(&fasttrig,(double)uVar5 * 5.625 * 11930464.711111112 + 6755399441055744.0
                          );
    dVar2 = dVar2 * 8.0 * local_70;
    local_70 = FFastTrig::cos(&fasttrig,dVar2);
    local_70 = local_70 * dVar2;
    dVar3 = FFastTrig::sin(&fasttrig,local_70);
    local_80.X = local_70 + local_80.X;
    local_80.Y = dVar3 * dVar2 + local_80.Y;
    if (((self->flags5).Value & 0x200000) == 0) {
      P_TryMove(self,&local_80,1,(secplane_t *)0x0);
    }
    else {
      AActor::UnlinkFromWorld(self);
      *(byte *)&(self->flags).Value = (byte)(self->flags).Value | 0x10;
      dVar2 = (self->__Pos).X;
      dVar3 = (self->__Pos).Y;
      local_80.X = local_80.X - dVar2;
      local_80.Y = local_80.Y - dVar3;
      P_GetOffsetPosition(dVar2,dVar3,local_80.X,local_80.Y);
      (self->__Pos).X = local_40;
      (self->__Pos).Y = local_38;
      AActor::LinkToWorld(self,false,(sector_t *)0x0);
    }
    self->WeaveIndexXY = (BYTE)uVar5;
    uVar5 = local_5c;
  }
  if ((zspeed != 0) && ((local_68 != 0.0 || (NAN(local_68))))) {
    dVar2 = FFastTrig::sin(&fasttrig,
                           (double)((byte)uVar5 & 0x3f) * 5.625 * 11930464.711111112 +
                           6755399441055744.0);
    (self->__Pos).Z = (self->__Pos).Z - dVar2 * 8.0 * local_68;
    uVar5 = zspeed + uVar5 & 0x3f;
    dVar2 = FFastTrig::sin(&fasttrig,(double)uVar5 * 5.625 * 11930464.711111112 + 6755399441055744.0
                          );
    (self->__Pos).Z = dVar2 * 8.0 * local_68 + (self->__Pos).Z;
    self->WeaveIndexZ = (BYTE)uVar5;
  }
  return;
}

Assistant:

void A_Weave(AActor *self, int xyspeed, int zspeed, double xydist, double zdist)
{
	DVector2 newpos;
	int weaveXY, weaveZ;
	DAngle angle;
	double dist;

	weaveXY = self->WeaveIndexXY & 63;
	weaveZ = self->WeaveIndexZ & 63;
	angle = self->Angles.Yaw + 90;

	if (xydist != 0 && xyspeed != 0)
	{
		dist = BobSin(weaveXY) * xydist;
		newpos = self->Pos().XY() - angle.ToVector(dist);
		weaveXY = (weaveXY + xyspeed) & 63;
		dist = BobSin(weaveXY) * xydist;
		newpos += angle.ToVector(dist);
		if (!(self->flags5 & MF5_NOINTERACTION))
		{
			P_TryMove (self, newpos, true);
		}
		else
		{
			self->UnlinkFromWorld ();
			self->flags |= MF_NOBLOCKMAP;
			// We need to do portal offsetting here explicitly, because SetXY cannot do that.
			newpos -= self->Pos().XY();
			self->SetXY(self->Vec2Offset(newpos.X, newpos.Y));
			self->LinkToWorld ();
		}
		self->WeaveIndexXY = weaveXY;
	}
	if (zdist != 0 && zspeed != 0)
	{
		self->AddZ(-BobSin(weaveZ) * zdist);
		weaveZ = (weaveZ + zspeed) & 63;
		self->AddZ(BobSin(weaveZ) * zdist);
		self->WeaveIndexZ = weaveZ;
	}
}